

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode hsts_load(hsts *h,char *file)

{
  char *pcVar1;
  FILE *__stream;
  char *pcVar2;
  bool bVar3;
  char *local_40;
  char *lineptr;
  FILE *fp;
  char *line;
  CURLcode result;
  char *file_local;
  hsts *h_local;
  
  (*Curl_cfree)(h->filename);
  pcVar1 = (*Curl_cstrdup)(file);
  h->filename = pcVar1;
  if (h->filename == (char *)0x0) {
    h_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    __stream = fopen64(file,"r");
    if (__stream != (FILE *)0x0) {
      pcVar1 = (char *)(*Curl_cmalloc)(0xfff);
      if (pcVar1 == (char *)0x0) {
        (*Curl_cfree)(h->filename);
        h->filename = (char *)0x0;
        fclose(__stream);
        return CURLE_OUT_OF_MEMORY;
      }
      while (pcVar2 = Curl_get_line(pcVar1,0xfff,(FILE *)__stream), local_40 = pcVar1,
            pcVar2 != (char *)0x0) {
        while( true ) {
          bVar3 = false;
          if ((*local_40 != '\0') && (bVar3 = true, *local_40 != ' ')) {
            bVar3 = *local_40 == '\t';
          }
          if (!bVar3) break;
          local_40 = local_40 + 1;
        }
        if (*local_40 != '#') {
          hsts_add(h,local_40);
        }
      }
      (*Curl_cfree)(pcVar1);
      fclose(__stream);
    }
    h_local._4_4_ = CURLE_OK;
  }
  return h_local._4_4_;
}

Assistant:

static CURLcode hsts_load(struct hsts *h, const char *file)
{
  CURLcode result = CURLE_OK;
  char *line = NULL;
  FILE *fp;

  /* we need a private copy of the file name so that the hsts cache file
     name survives an easy handle reset */
  free(h->filename);
  h->filename = strdup(file);
  if(!h->filename)
    return CURLE_OUT_OF_MEMORY;

  fp = fopen(file, FOPEN_READTEXT);
  if(fp) {
    line = malloc(MAX_HSTS_LINE);
    if(!line)
      goto fail;
    while(Curl_get_line(line, MAX_HSTS_LINE, fp)) {
      char *lineptr = line;
      while(*lineptr && ISBLANK(*lineptr))
        lineptr++;
      if(*lineptr == '#')
        /* skip commented lines */
        continue;

      hsts_add(h, lineptr);
    }
    free(line); /* free the line buffer */
    fclose(fp);
  }
  return result;

  fail:
  Curl_safefree(h->filename);
  fclose(fp);
  return CURLE_OUT_OF_MEMORY;
}